

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestEmpty::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestEmpty((ParserTestEmpty *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, Empty) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(""));
}